

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall
bidirectional::BiDirectional::saveCurrentBestLabel(BiDirectional *this,Directions *direction)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  Search *this_00;
  element_type *peVar4;
  reference pvVar5;
  pointer pDVar6;
  Directions *pDVar7;
  int *in_RSI;
  Label *in_RDI;
  bool improvement_found;
  shared_ptr<labelling::Label> *current_label_ptr;
  shared_ptr<labelling::Label> *intermediate_label_ptr;
  Search *search_ptr;
  shared_ptr<labelling::Label> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  Directions in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  value_type in_stack_ffffffffffffff9c;
  Search *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 uVar8;
  undefined1 uVar9;
  Label *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  Label *this_01;
  
  this_00 = getSearchPtr((BiDirectional *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94);
  this_01 = (Label *)&this_00->current_label;
  peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2461af);
  if ((peVar4->vertex).lemon_id == -1) {
    std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    std::make_shared<labelling::Label,labelling::Label&>(in_RDI);
    std::shared_ptr<labelling::Label>::operator=
              ((shared_ptr<labelling::Label> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    std::shared_ptr<labelling::Label>::~shared_ptr((shared_ptr<labelling::Label> *)0x2461e5);
    return;
  }
  std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2461f4);
  uVar9 = 0;
  bVar2 = labelling::Label::checkFeasibility
                    (this_01,in_stack_ffffffffffffffd0,
                     (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffc8,
                     (bool *)(ulong)CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    return;
  }
  uVar8 = 0;
  peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24622e);
  iVar1 = (peVar4->vertex).lemon_id;
  peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24623f);
  if (iVar1 == (peVar4->vertex).lemon_id) {
    std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x246255);
    std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar2 = labelling::Label::fullDominance
                      (in_stack_ffffffffffffffc8,
                       (Label *)CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffffc0)),
                       (Directions *)in_RDI);
    if (bVar2) {
      std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      Search::replaceIntermediateLabel
                (this_00,(Label *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      return;
    }
  }
  if (*in_RSI == 0) {
    std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2462bb);
    pvVar5 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff9c = *pvVar5;
    pDVar6 = std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
             operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                         *)0x2462db);
    if (in_stack_ffffffffffffff9c == (pDVar6->sink).user_id) {
      peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2462f1);
      in_stack_ffffffffffffff98 = (peVar4->vertex).user_id;
      pDVar6 = std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
               ::operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                             *)0x246306);
      if (in_stack_ffffffffffffff98 == (pDVar6->source).user_id) goto LAB_00246385;
    }
  }
  if (*in_RSI != 1) {
    return;
  }
  std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x24632a);
  pDVar7 = (Directions *)
           std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  in_stack_ffffffffffffff94 = *pDVar7;
  pDVar6 = std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
           operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                       *)0x24634a);
  if (in_stack_ffffffffffffff94 != (pDVar6->source).user_id) {
    return;
  }
  peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x246364);
  in_stack_ffffffffffffff90 = (peVar4->vertex).user_id;
  pDVar6 = std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
           operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                       *)0x246379);
  if (in_stack_ffffffffffffff90 != (pDVar6->sink).user_id) {
    return;
  }
LAB_00246385:
  std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  Search::replaceIntermediateLabel
            (in_stack_ffffffffffffffa0,
             (Label *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  uVar3 = std::isnan((double)(in_RDI->unreachable_nodes)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_parent);
  if (((uVar3 & 1) != 0) ||
     (peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2463c6),
     peVar4->weight <
     (double)(in_RDI->unreachable_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)) {
    peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2463e7);
    (in_RDI->unreachable_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)peVar4->weight;
  }
  return;
}

Assistant:

void BiDirectional::saveCurrentBestLabel(const Directions& direction) {
  Search* search_ptr = getSearchPtr(direction);

  std::shared_ptr<labelling::Label>& intermediate_label_ptr =
      search_ptr->intermediate_label;
  std::shared_ptr<labelling::Label>& current_label_ptr =
      search_ptr->current_label;

  if (intermediate_label_ptr->vertex.lemon_id == -1) {
    intermediate_label_ptr =
        std::make_shared<labelling::Label>(*current_label_ptr);
    return;
  }
  // Check for global feasibility
  if (!current_label_ptr->checkFeasibility(max_res, min_res)) {
    return;
  }
  bool improvement_found = false;
  if (intermediate_label_ptr->vertex.lemon_id ==
          current_label_ptr->vertex.lemon_id &&
      current_label_ptr->fullDominance(*intermediate_label_ptr, direction)) {
    // Save complete source-sink path
    search_ptr->replaceIntermediateLabel(*current_label_ptr);
    improvement_found = true;
  } else {
    // First source-sink path
    if ((direction == FWD &&
         (current_label_ptr->partial_path.back() == graph_ptr_->sink.user_id &&
          intermediate_label_ptr->vertex.user_id ==
              graph_ptr_->source.user_id)) ||
        (direction == BWD && (current_label_ptr->partial_path.back() ==
                                  graph_ptr_->source.user_id &&
                              intermediate_label_ptr->vertex.user_id ==
                                  graph_ptr_->sink.user_id))) {
      // Save complete source-sink path
      search_ptr->replaceIntermediateLabel(*current_label_ptr);
      improvement_found = true;
      // Update bounds
      if (std::isnan(primal_st_bound_) ||
          intermediate_label_ptr->weight < primal_st_bound_) {
        primal_st_bound_ = intermediate_label_ptr->weight;
      }
    }
  }

  if (improvement_found) {
    SPDLOG_INFO(
        "\t {} \t | \t {}", getElapsedTime(), current_label_ptr->weight);
    SPDLOG_DEBUG(
        "******* Global improvement {}.",
        search_ptr->intermediate_label->getString());
  }
}